

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O2

void __thiscall agge::tests::ArcCurveTests::ArcPointsAreOnCircle(ArcCurveTests *this)

{
  bool value;
  real_t x;
  real_t y;
  int command;
  arc a;
  float local_c4;
  path_commands local_c0;
  allocator local_b9;
  float local_b8;
  float local_b4;
  float local_b0;
  int local_ac;
  string local_a8;
  LocationInfo local_88;
  double local_60;
  double local_58;
  arc local_50;
  
  arc::arc(&local_50,13.1,-17.2,10.1,0.0,1.5707964,0.05);
  arc::vertex(&local_50,&local_c4,&local_b8);
  value = false;
  while( true ) {
    local_b0 = local_c4;
    local_b4 = local_b8;
    local_ac = arc::vertex(&local_50,&local_c4,&local_b8);
    if (local_ac != 2) break;
    std::__cxx11::string::string
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,(allocator *)&local_c0);
    ut::LocationInfo::LocationInfo(&local_88,&local_a8,0x156);
    ut::are_not_equal<float,float>(&local_b0,&local_c4,&local_88);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,(allocator *)&local_c0);
    ut::LocationInfo::LocationInfo(&local_88,&local_a8,0x157);
    ut::are_not_equal<float,float>(&local_b4,&local_b8,&local_88);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_58 = (double)local_c4;
    local_60 = (double)local_b8;
    std::__cxx11::string::string
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,(allocator *)&local_c0);
    ut::LocationInfo::LocationInfo(&local_88,&local_a8,0x158);
    ut::is_on_circle(13.100000381469727,-17.200000762939453,10.100000381469727,local_58,local_60,
                     &local_88);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    value = true;
  }
  std::__cxx11::string::string
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,(allocator *)&local_c0);
  ut::LocationInfo::LocationInfo(&local_88,&local_a8,0x15d);
  ut::is_true(value,&local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c0 = path_command_stop;
  std::__cxx11::string::string
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_b9);
  ut::LocationInfo::LocationInfo(&local_88,&local_a8,0x15e);
  ut::are_equal<agge::path_commands,int>(&local_c0,&local_ac,&local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( ArcPointsAreOnCircle )
			{
				// INIT
				bool had_output = false;
				int command;
				real_t x, y, prev_x, prev_y;
				arc a(13.1f, -17.2f, 10.1f, 0.0f * pi, 0.5f * pi);

				a.vertex(&x, &y);
				prev_x = x, prev_y = y;

				// ACT / ASSERT
				while (command = a.vertex(&x, &y), command == path_command_line_to)
				{
					had_output = true;
					assert_not_equal(prev_x, x);
					assert_not_equal(prev_y, y);
					assert_point_on_circle(13.1f, -17.2f, 10.1f, x, y);
					prev_x = x, prev_y = y;
				}

				// ASSERT
				assert_is_true(had_output);
				assert_equal(path_command_stop, command);
			}